

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O2

void Gia_ManCorrRemapSimInfo(Gia_Man_t *p,Vec_Ptr_t *vInfo)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  Gia_Obj_t *pObj;
  Gia_Obj_t *pObj_00;
  void *pvVar4;
  void *pvVar5;
  ulong uVar6;
  int i;
  ulong uVar7;
  
  uVar2 = Vec_PtrReadWordsSimInfo(vInfo);
  uVar7 = (ulong)uVar2;
  i = 0;
  if ((int)uVar2 < 1) {
    uVar7 = 0;
    i = 0;
  }
  while( true ) {
    if (p->nRegs <= i) {
      return;
    }
    pObj = Gia_ManCi(p,(i - p->nRegs) + p->vCis->nSize);
    if (pObj == (Gia_Obj_t *)0x0) break;
    iVar3 = Gia_ObjId(p,pObj);
    pObj_00 = Gia_ObjReprObj(p,iVar3);
    if ((pObj_00 != (Gia_Obj_t *)0x0) &&
       (iVar3 = Gia_ObjId(p,pObj), (p->pReprs[iVar3].field_0x3 & 0x20) == 0)) {
      pvVar4 = Vec_PtrEntry(vInfo,i);
      uVar6 = 0;
      while (uVar7 != uVar6) {
        lVar1 = uVar6 * 4;
        uVar6 = uVar6 + 1;
        if (*(int *)((long)pvVar4 + lVar1) != 0) {
          __assert_fail("pInfoObj[w] == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecCorr.c"
                        ,0x151,"void Gia_ManCorrRemapSimInfo(Gia_Man_t *, Vec_Ptr_t *)");
        }
      }
      if ((~*(ulong *)pObj_00 & 0x1fffffff1fffffff) != 0) {
        iVar3 = Gia_ObjIsRo(p,pObj_00);
        if (iVar3 == 0) {
          __assert_fail("Gia_ObjIsRo(p, pRepr)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecCorr.c"
                        ,0x155,"void Gia_ManCorrRemapSimInfo(Gia_Man_t *, Vec_Ptr_t *)");
        }
        iVar3 = Gia_ObjCioId(pObj_00);
        pvVar5 = Vec_PtrEntry(vInfo,(iVar3 - p->vCis->nSize) + p->nRegs);
        for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
          *(undefined4 *)((long)pvVar4 + uVar6 * 4) = *(undefined4 *)((long)pvVar5 + uVar6 * 4);
        }
      }
    }
    i = i + 1;
  }
  return;
}

Assistant:

void Gia_ManCorrRemapSimInfo( Gia_Man_t * p, Vec_Ptr_t * vInfo )
{
    Gia_Obj_t * pObj, * pRepr;
    unsigned * pInfoObj, * pInfoRepr;
    int i, w, nWords;
    nWords = Vec_PtrReadWordsSimInfo( vInfo );
    Gia_ManForEachRo( p, pObj, i )
    {
        // skip ROs without representatives
        pRepr = Gia_ObjReprObj( p, Gia_ObjId(p,pObj) );
        if ( pRepr == NULL || Gia_ObjFailed(p, Gia_ObjId(p,pObj)) )
            continue;
        pInfoObj = (unsigned *)Vec_PtrEntry( vInfo, i );
        for ( w = 0; w < nWords; w++ )
            assert( pInfoObj[w] == 0 );
        // skip ROs with constant representatives
        if ( Gia_ObjIsConst0(pRepr) )
            continue;
        assert( Gia_ObjIsRo(p, pRepr) );
//        Abc_Print( 1, "%d -> %d    ", i, Gia_ObjId(p, pRepr) );
        // transfer info from the representative
        pInfoRepr = (unsigned *)Vec_PtrEntry( vInfo, Gia_ObjCioId(pRepr) - Gia_ManPiNum(p) );
        for ( w = 0; w < nWords; w++ )
            pInfoObj[w] = pInfoRepr[w];
    }
//    Abc_Print( 1, "\n" );
}